

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

void __thiscall FxConditional::~FxConditional(FxConditional *this)

{
  ~FxConditional(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

FxConditional::~FxConditional()
{
	SAFE_DELETE(condition);
	SAFE_DELETE(truex);
	SAFE_DELETE(falsex);
}